

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O0

void QThreadStoragePrivate::finish(QList<void_*> *tls)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  Type *pTVar4;
  void **ppvVar5;
  qsizetype qVar6;
  _func_void_void_ptr *p_Var7;
  QThread *pQVar8;
  QList<void_*> *in_RDI;
  long in_FS_OFFSET;
  _func_void_void_ptr *destructor;
  int i;
  void *q;
  void **value;
  QMutexLocker<QBasicMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>
  *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  reference in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  QMessageLogger local_38;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QList<void_*>::isEmpty((QList<void_*> *)0x6d6efb);
  if ((!bVar2) &&
     (pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::
               operator()(in_stack_ffffffffffffff58), pTVar4 != (Type *)0x0)) {
    while (bVar2 = QList<void_*>::isEmpty((QList<void_*> *)0x6d6f22), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppvVar5 = QList<void_*>::last((QList<void_*> *)in_stack_ffffffffffffff58);
      pvVar1 = *ppvVar5;
      *ppvVar5 = (void *)0x0;
      qVar6 = QList<void_*>::size(in_RDI);
      uVar3 = (int)qVar6 - 1;
      QList<void_*>::resize
                ((QList<void_*> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (qsizetype)in_stack_ffffffffffffff68);
      if (pvVar1 != (void *)0x0) {
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
        QMutexLocker<QBasicMutex>::QMutexLocker
                  ((QMutexLocker<QBasicMutex> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (QBasicMutex *)in_stack_ffffffffffffff58);
        QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::operator()
                  (in_stack_ffffffffffffff58);
        p_Var7 = QList<void_(*)(void_*)>::value
                           ((QList<void_(*)(void_*)> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (qsizetype)in_stack_ffffffffffffff58);
        QMutexLocker<QBasicMutex>::unlock
                  ((QMutexLocker<QBasicMutex> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        if (p_Var7 == (_func_void_void_ptr *)0x0) {
          bVar2 = QCoreApplication::instanceExists();
          if (bVar2) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                       (char *)in_stack_ffffffffffffff58);
            pQVar8 = QThread::currentThread();
            QMessageLogger::warning
                      (&local_38,"QThreadStorage: entry %d destroyed before end of thread %p",
                       (ulong)uVar3,pQVar8);
            in_stack_ffffffffffffff74 = uVar3;
          }
        }
        else {
          (*p_Var7)(pvVar1);
          qVar6 = QList<void_*>::size(in_RDI);
          if ((int)uVar3 < qVar6) {
            in_stack_ffffffffffffff68 =
                 QList<void_*>::operator[]
                           ((QList<void_*> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (qsizetype)in_stack_ffffffffffffff58);
            *in_stack_ffffffffffffff68 = (void *)0x0;
          }
        }
        QMutexLocker<QBasicMutex>::~QMutexLocker
                  ((QMutexLocker<QBasicMutex> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
    }
    QList<void_*>::clear
              ((QList<void_*> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadStoragePrivate::finish(QList<void *> *tls)
{
    if (tls->isEmpty() || !destructors())
        return; // nothing to do

    DEBUG_MSG("QThreadStorageData: Destroying storage for thread %p", QThread::currentThread());
    while (!tls->isEmpty()) {
        void *&value = tls->last();
        void *q = value;
        value = nullptr;
        int i = tls->size() - 1;
        tls->resize(i);

        if (!q) {
            // data already deleted
            continue;
        }

        QMutexLocker locker(&destructorsMutex);
        void (*destructor)(void *) = destructors()->value(i);
        locker.unlock();

        if (!destructor) {
            if (QCoreApplication::instanceExists())
                qWarning("QThreadStorage: entry %d destroyed before end of thread %p",
                         i, QThread::currentThread());
            continue;
        }
        destructor(q); //crash here might mean the thread exited after qthreadstorage was destroyed

        if (tls->size() > i) {
            //re reset the tls in case it has been recreated by its own destructor.
            (*tls)[i] = nullptr;
        }
    }
    tls->clear();
}